

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O1

base_learner * cb_adf_setup(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  bool bVar3;
  vw *pvVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  cb_adf *pcVar9;
  _func_int ***__dest;
  option_group_definition *poVar10;
  long *__dest_00;
  base_learner *l;
  multi_learner *base;
  learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar11;
  long lVar12;
  size_t sVar13;
  undefined **ppuVar14;
  label_parser *plVar15;
  byte bVar16;
  byte bVar17;
  options_i *poVar18;
  byte bVar19;
  bool cb_adf_option;
  string type_string;
  size_type __dnew_4;
  size_type __dnew;
  option_group_definition new_options;
  size_type __dnew_3;
  size_type __dnew_1;
  size_type __dnew_2;
  bool local_459;
  cb_adf *local_458;
  options_i *local_450;
  size_t local_448;
  vw *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  _func_int ***local_418;
  _func_int **local_410;
  _func_int **local_408 [2];
  bool *local_3f8;
  long local_3f0;
  undefined1 local_3e8 [112];
  bool local_378;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_360;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  _func_int ***local_348;
  _func_int **local_340;
  _func_int **local_338 [2];
  _func_int ***local_328;
  _func_int **local_320;
  _func_int **local_318 [2];
  _func_int ***local_308;
  _func_int **local_300;
  _func_int **local_2f8 [2];
  string local_2e8;
  string local_2c8;
  string local_2a8;
  option_group_definition local_288;
  long *local_250;
  long local_248;
  long local_240 [2];
  undefined1 local_230 [112];
  bool local_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  string local_190;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar19 = 0;
  pcVar9 = calloc_or_throw<CB_ADF::cb_adf>(1);
  memset(pcVar9,0,0x168);
  local_459 = false;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  local_438.field_2._M_allocated_capacity._0_4_ = 0x72746d;
  local_438._M_string_length = 3;
  local_3e8._0_8_ = (_func_int **)0x30;
  local_458 = pcVar9;
  local_418 = local_408;
  local_418 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)local_3e8);
  local_408[0] = (_func_int **)local_3e8._0_8_;
  local_418[4] = (_func_int **)0x20746e65646e6570;
  local_418[5] = (_func_int **)0x7365727574616546;
  local_418[2] = (_func_int **)0x4120687469772074;
  local_418[3] = (_func_int **)0x6544206e6f697463;
  *(undefined4 *)local_418 = 0x746e6f43;
  builtin_strncpy((char *)((long)local_418 + 4),"extu",4);
  *(undefined4 *)(local_418 + 1) = 0x42206c61;
  builtin_strncpy((char *)((long)local_418 + 0xc),"andi",4);
  local_410 = (_func_int **)local_3e8._0_8_;
  *(char *)((long)local_418 + local_3e8._0_8_) = '\0';
  local_288.m_name._M_dataplus._M_p = (pointer)&local_288.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,local_418,(char *)(local_3e8._0_8_ + (long)local_418));
  local_288.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8.field_2._M_allocated_capacity._0_4_ = 0x615f6263;
  local_2a8.field_2._M_allocated_capacity._4_2_ = 0x6664;
  local_2a8._M_string_length = 6;
  local_2a8.field_2._M_local_buf[6] = '\0';
  local_450 = options;
  local_440 = all;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3e8,&local_2a8,&local_459);
  local_378 = true;
  local_308 = local_2f8;
  local_170._0_8_ = (_func_int **)0x47;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_308,(ulong)local_170);
  uVar5 = local_170._0_8_;
  local_2f8[0] = (_func_int **)local_170._0_8_;
  local_308 = __dest;
  memcpy(__dest,"Do Contextual Bandit learning with multiline action dependent features.",0x47);
  local_300 = (_func_int **)uVar5;
  *(undefined1 *)((long)__dest + uVar5) = 0;
  std::__cxx11::string::_M_assign((string *)(local_3e8 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (&local_288,(typed_option<bool> *)local_3e8);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity = 0x6c6c615f6b6e6172;
  local_2c8._M_string_length = 8;
  local_2c8.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_2c8,&pcVar9->rank_all);
  local_100 = true;
  local_328 = local_318;
  local_d0._0_8_ = (_func_int **)0x24;
  local_328 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)local_d0);
  local_318[0] = (_func_int **)local_d0._0_8_;
  local_328[2] = (_func_int **)0x796220646574726f;
  local_328[3] = (_func_int **)0x6f2065726f637320;
  *local_328 = (_func_int **)0x61206e7275746552;
  local_328[1] = (_func_int **)0x7320736e6f697463;
  *(undefined4 *)(local_328 + 4) = 0x72656472;
  local_320 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_328 + local_d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar10,(typed_option<bool> *)local_170);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8.field_2._M_allocated_capacity = 0x69646572705f6f6e;
  local_2e8.field_2._8_2_ = 0x7463;
  local_2e8._M_string_length = 10;
  local_2e8.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_d0,&local_2e8,&pcVar9->no_predict);
  local_348 = local_338;
  local_230._0_8_ = (_func_int **)0x24;
  local_348 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)local_230);
  local_338[0] = (_func_int **)local_230._0_8_;
  local_348[2] = (_func_int **)0x77206e6f69746369;
  local_348[3] = (_func_int **)0x69617274206e6568;
  *local_348 = (_func_int **)0x6420746f6e206f44;
  local_348[1] = (_func_int **)0x646572702061206f;
  *(undefined4 *)(local_348 + 4) = 0x676e696e;
  local_340 = (_func_int **)local_230._0_8_;
  *(char *)((long)local_348 + local_230._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar10,(typed_option<bool> *)local_d0);
  local_190.field_2._M_allocated_capacity._0_4_ = 0x745f6263;
  local_190.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_190._M_string_length = 7;
  local_190.field_2._M_local_buf[7] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_230,&local_190,&local_438);
  local_1c0 = true;
  local_3f0 = 0x47;
  local_3f8 = &pcVar9->rank_all;
  local_250 = local_240;
  __dest_00 = (long *)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_3f0);
  lVar12 = local_3f0;
  local_240[0] = local_3f0;
  local_250 = __dest_00;
  memcpy(__dest_00,"contextual bandit method to use in {ips, dm, dr, mtr, sm}. Default: mtr",0x47);
  local_248 = lVar12;
  *(undefined1 *)((long)__dest_00 + lVar12) = 0;
  std::__cxx11::string::_M_assign((string *)(local_230 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar10,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_230);
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  local_230._0_8_ = &PTR__typed_option_002d5018;
  if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198._M_pi);
  }
  if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  pvVar4 = local_440;
  poVar18 = local_450;
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  local_d0._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  local_170._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  local_3e8._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350._M_pi);
  }
  if (local_360._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  (**poVar18->_vptr_options_i)(poVar18,&local_288);
  if (local_459 == false) {
    plVar11 = (learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
    goto LAB_0025042b;
  }
  pp_Var2 = (_func_int **)(local_3e8 + 0x10);
  local_3e8._16_4_ = 0x745f6263;
  local_3e8[0x14] = 0x79;
  local_3e8._21_2_ = 0x6570;
  local_3e8._8_8_ = (pointer)0x7;
  local_3e8[0x17] = 0;
  local_3e8._0_8_ = pp_Var2;
  iVar6 = (*poVar18->_vptr_options_i[1])(poVar18,local_3e8);
  if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
    operator_delete((void *)local_3e8._0_8_);
  }
  if ((char)iVar6 == '\0') {
    local_3e8._16_4_ = 0x745f6263;
    local_3e8[0x14] = 0x79;
    local_3e8._21_2_ = 0x6570;
    local_3e8._8_8_ = (pointer)0x7;
    local_3e8[0x17] = 0;
    local_3e8._0_8_ = pp_Var2;
    (*poVar18->_vptr_options_i[5])(poVar18,local_3e8,&local_438);
    if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
      operator_delete((void *)local_3e8._0_8_);
    }
    (**poVar18->_vptr_options_i)(poVar18,&local_288);
  }
  local_458->all = pvVar4;
  iVar6 = std::__cxx11::string::compare((char *)&local_438);
  if (iVar6 == 0) {
    local_448 = 2;
    sVar13 = 0;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)&local_438);
    local_448 = 1;
    if (iVar7 == 0) {
      sVar13 = 2;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&local_438);
      sVar13 = 3;
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::string::compare((char *)&local_438);
        local_448 = 1;
        if (iVar7 == 0) {
          sVar13 = 1;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&local_438);
          if (iVar7 == 0) {
            sVar13 = 4;
          }
          else {
            pvVar1 = &pvVar4->trace_message;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream,
                       "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\',\'dm\',\'sm\'}; resetting to mtr."
                       ,0x4b);
            std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
            std::ostream::put((char)pvVar1);
            std::ostream::flush();
          }
        }
      }
    }
  }
  (local_458->gen_cs).cb_type = sVar13;
  pvVar4->delete_prediction = ACTION_SCORE::delete_action_scores;
  local_3e8._16_4_ = 0x616f7363;
  local_3e8[0x14] = 0x61;
  local_3e8._21_2_ = 0x6c5f;
  local_3e8[0x17] = 100;
  local_3e8[0x18] = 'f';
  local_3e8[0x19] = '\0';
  local_3e8._8_8_ = (pointer)0x9;
  local_3e8._0_8_ = pp_Var2;
  iVar7 = (*poVar18->_vptr_options_i[1])(poVar18);
  if ((byte)iVar7 == 0) {
    local_170._0_8_ = local_170 + 0x10;
    local_170._16_4_ = 0x5f706177;
    local_170._20_3_ = 0x66646c;
    local_170._8_8_ = (pointer)0x7;
    local_170[0x17] = 0;
    iVar8 = (*poVar18->_vptr_options_i[1])(poVar18,local_170);
    if ((char)iVar8 != '\0') goto LAB_0025005a;
    bVar17 = 1;
    bVar3 = false;
    bVar16 = 1;
  }
  else {
LAB_0025005a:
    bVar17 = (byte)iVar7 ^ 1;
    if (*local_3f8 == false) {
      local_d0._0_8_ = local_d0 + 0x10;
      local_d0._16_8_ = 0x61725f61616f7363;
      local_d0._24_2_ = 0x6b6e;
      local_d0._8_8_ = (pointer)0xa;
      local_d0[0x1a] = '\0';
      iVar7 = (*poVar18->_vptr_options_i[1])(poVar18,local_d0);
      bVar16 = (byte)iVar7 ^ 1;
      bVar3 = true;
    }
    else {
      bVar16 = 1;
      bVar3 = false;
    }
  }
  if ((bVar3) && ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((bVar17 != 0) && ((undefined1 *)local_170._0_8_ != local_170 + 0x10)) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
    operator_delete((void *)local_3e8._0_8_);
  }
  poVar18 = local_450;
  if (bVar16 != 0) {
    local_3e8._16_4_ = 0x616f7363;
    local_3e8[0x14] = 0x61;
    local_3e8._21_2_ = 0x6c5f;
    local_3e8[0x17] = 100;
    local_3e8[0x18] = 'f';
    local_3e8[0x19] = '\0';
    local_3e8._8_8_ = (pointer)0x9;
    local_3e8._0_8_ = pp_Var2;
    iVar7 = (*local_450->_vptr_options_i[1])(local_450);
    if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
      operator_delete((void *)local_3e8._0_8_);
    }
    poVar18 = local_450;
    if ((char)iVar7 == '\0') {
      local_3e8._16_4_ = 0x616f7363;
      local_3e8[0x14] = 0x61;
      local_3e8._21_2_ = 0x6c5f;
      local_3e8[0x17] = 100;
      local_3e8[0x18] = 'f';
      local_3e8[0x19] = '\0';
      local_3e8._8_8_ = (pointer)0x9;
      local_230._16_8_ = 0x6e696c69746c756d;
      local_230._24_2_ = 0x65;
      local_230._8_8_ = (pointer)0x9;
      local_3e8._0_8_ = pp_Var2;
      local_230._0_8_ = local_230 + 0x10;
      (*local_450->_vptr_options_i[5])(local_450,local_3e8,local_230);
      if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
        operator_delete((void *)local_230._0_8_);
      }
      if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
        operator_delete((void *)local_3e8._0_8_);
      }
    }
    local_3e8._16_4_ = 0x616f7363;
    local_3e8[0x14] = 0x61;
    local_3e8._21_2_ = 0x725f;
    local_3e8[0x17] = 0x61;
    local_3e8[0x18] = 'n';
    local_3e8[0x19] = 'k';
    local_3e8._8_8_ = (pointer)0xa;
    local_3e8[0x1a] = '\0';
    local_3e8._0_8_ = pp_Var2;
    iVar7 = (*poVar18->_vptr_options_i[1])(poVar18);
    if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
      operator_delete((void *)local_3e8._0_8_);
    }
    poVar18 = local_450;
    if ((char)iVar7 == '\0') {
      local_3e8._16_4_ = 0x616f7363;
      local_3e8[0x14] = 0x61;
      local_3e8._21_2_ = 0x725f;
      local_3e8[0x17] = 0x61;
      local_3e8[0x18] = 'n';
      local_3e8[0x19] = 'k';
      local_3e8._8_8_ = (pointer)0xa;
      local_3e8[0x1a] = '\0';
      local_230._8_8_ = (pointer)0x0;
      local_230._16_8_ = local_230._16_8_ & 0xffffffffffffff00;
      local_3e8._0_8_ = pp_Var2;
      local_230._0_8_ = local_230 + 0x10;
      (*local_450->_vptr_options_i[5])(local_450,local_3e8,local_230);
      if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
        operator_delete((void *)local_230._0_8_);
      }
      if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
        operator_delete((void *)local_3e8._0_8_);
      }
    }
  }
  local_3e8._16_4_ = 0x65736162;
  local_3e8[0x14] = 0x6c;
  local_3e8._21_2_ = 0x6e69;
  local_3e8[0x17] = 0x65;
  local_3e8._8_8_ = (pointer)0x8;
  local_3e8[0x18] = '\0';
  local_3e8._0_8_ = pp_Var2;
  iVar7 = (*poVar18->_vptr_options_i[1])(poVar18);
  pvVar4 = local_440;
  if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
    operator_delete((void *)local_3e8._0_8_);
  }
  if ((iVar6 == 0 & (byte)iVar7) != 0) {
    local_3e8._16_4_ = 0x63656863;
    local_3e8[0x14] = 0x6b;
    local_3e8._21_2_ = 0x655f;
    local_3e8[0x17] = 0x6e;
    local_3e8[0x18] = 'a';
    local_3e8[0x19] = 'b';
    local_3e8[0x1a] = 'l';
    local_3e8._27_2_ = 0x6465;
    local_3e8._8_8_ = (pointer)0xd;
    local_3e8[0x1d] = '\0';
    local_230._8_8_ = (pointer)0x0;
    local_230._16_8_ = local_230._16_8_ & 0xffffffffffffff00;
    local_3e8._0_8_ = pp_Var2;
    local_230._0_8_ = local_230 + 0x10;
    (*local_450->_vptr_options_i[5])(local_450,local_3e8,local_230);
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_);
    }
    if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
      operator_delete((void *)local_3e8._0_8_);
    }
  }
  l = setup_base(local_450,pvVar4);
  base = LEARNER::as_multiline<char,char>(l);
  pcVar9 = local_458;
  ppuVar14 = &CB::cb_label;
  plVar15 = &pvVar4->p->lp;
  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
    plVar15->default_label = (_func_void_void_ptr *)*ppuVar14;
    ppuVar14 = ppuVar14 + (ulong)bVar19 * -2 + 1;
    plVar15 = (label_parser *)((long)plVar15 + (ulong)bVar19 * -0x10 + 8);
  }
  pvVar4->label_type = cb;
  plVar11 = LEARNER::learner<CB_ADF::cb_adf,std::vector<example*,std::allocator<example*>>>::
            init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                      (local_458,base,CB_ADF::do_actual_learning<true>,
                       CB_ADF::do_actual_learning<false>,local_448,action_scores);
  *(undefined8 *)(plVar11 + 0x58) = *(undefined8 *)(plVar11 + 0x18);
  *(code **)(plVar11 + 0x68) = CB_ADF::finish_multiline_example;
  (pcVar9->gen_cs).scorer = pvVar4->scorer;
  *(undefined8 *)(plVar11 + 0xb8) = *(undefined8 *)(plVar11 + 0x18);
  *(undefined8 *)(plVar11 + 0xc0) = *(undefined8 *)(plVar11 + 0x20);
  *(code **)(plVar11 + 200) = CB_ADF::finish;
  *(code **)(plVar11 + 0x80) = CB_ADF::save_load;
  *(undefined8 *)(plVar11 + 0x70) = *(undefined8 *)(plVar11 + 0x18);
  *(undefined8 *)(plVar11 + 0x78) = *(undefined8 *)(plVar11 + 0x20);
  local_458 = (cb_adf *)0x0;
LAB_0025042b:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_288.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p != &local_288.m_name.field_2) {
    operator_delete(local_288.m_name._M_dataplus._M_p);
  }
  pcVar9 = local_458;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p);
  }
  if (pcVar9 != (cb_adf *)0x0) {
    destroy_free<CB_ADF::cb_adf>(pcVar9);
  }
  return (base_learner *)plVar11;
}

Assistant:

base_learner* cb_adf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<cb_adf>();
  bool cb_adf_option = false;
  std::string type_string = "mtr";

  option_group_definition new_options("Contextual Bandit with Action Dependent Features");
  new_options
      .add(make_option("cb_adf", cb_adf_option)
               .keep()
               .help("Do Contextual Bandit learning with multiline action dependent features."))
      .add(make_option("rank_all", ld->rank_all).keep().help("Return actions sorted by score order"))
      .add(make_option("no_predict", ld->no_predict).help("Do not do a prediction when training"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips, dm, dr, mtr, sm}. Default: mtr"));
  options.add_and_parse(new_options);

  if (!cb_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  ld->all = &all;

  // number of weight vectors needed
  size_t problem_multiplier = 1;  // default for IPS
  bool check_baseline_enabled = false;

  if (type_string.compare("dr") == 0)
  {
    ld->gen_cs.cb_type = CB_TYPE_DR;
    problem_multiplier = 2;
    // only use baseline when manually enabled for loss estimation
    check_baseline_enabled = true;
  }
  else if (type_string.compare("ips") == 0)
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  else if (type_string.compare("mtr") == 0)
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  else if (type_string.compare("dm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_DM;
  else if (type_string.compare("sm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_SM;
  else
  {
    all.trace_message << "warning: cb_type must be in {'ips','dr','mtr','dm','sm'}; resetting to mtr." << std::endl;
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  }

  all.delete_prediction = ACTION_SCORE::delete_action_scores;

  // Push necessary flags.
  if ((!options.was_supplied("csoaa_ldf") && !options.was_supplied("wap_ldf")) || ld->rank_all ||
      !options.was_supplied("csoaa_rank"))
  {
    if (!options.was_supplied("csoaa_ldf"))
    {
      options.insert("csoaa_ldf", "multiline");
    }

    if (!options.was_supplied("csoaa_rank"))
    {
      options.insert("csoaa_rank", "");
    }
  }

  if (options.was_supplied("baseline") && check_baseline_enabled)
  {
    options.insert("check_enabled", "");
  }

  auto base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  cb_adf* bare = ld.get();
  learner<cb_adf, multi_ex>& l = init_learner(ld, base, CB_ADF::do_actual_learning<true>,
      CB_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_scores);
  l.set_finish_example(CB_ADF::finish_multiline_example);

  bare->gen_cs.scorer = all.scorer;

  l.set_finish(CB_ADF::finish);
  l.set_save_load(CB_ADF::save_load);
  return make_base(l);
}